

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::CopySourceCodeInfoToTest::CopySourceCodeInfoToTest
          (CopySourceCodeInfoToTest *this)

{
  string local_70;
  string local_50;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CopySourceCodeInfoToTest_0188b108;
  (this->collector_).super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__ErrorCollector_0188af38;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/test/test.proto","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"syntax = \"proto2\";\nmessage Foo {}\n","");
  SingletonSourceTree::SingletonSourceTree(&this->source_tree_,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  compiler::SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
            (&this->db_,&(this->source_tree_).super_SourceTree);
  DescriptorPool::DescriptorPool
            (&this->pool_,&(this->db_).super_DescriptorDatabase,
             &(this->collector_).super_ErrorCollector);
  return;
}

Assistant:

CopySourceCodeInfoToTest()
      : source_tree_("/test/test.proto", kCopySourceCodeInfoToTestInput),
        db_(&source_tree_),
        pool_(&db_, &collector_) {}